

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O3

void __thiscall inja::DataNode::DataNode(DataNode *this,string_view ptr_name,size_t pos)

{
  string_view ptr_name_00;
  string local_48;
  
  ptr_name_00._M_len = ptr_name._M_str;
  (this->super_ExpressionNode).super_AstNode.pos = pos;
  (this->super_ExpressionNode).super_AstNode._vptr_AstNode = (_func_int **)&PTR_accept_001afc88;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->name,ptr_name_00._M_len,ptr_name_00._M_len + (long)ptr_name._M_len);
  ptr_name_00._M_str = (char *)pos;
  convert_dot_to_ptr_abi_cxx11_(&local_48,(DataNode *)ptr_name._M_len,ptr_name_00);
  nlohmann::json_abi_v3_11_3::
  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  split(&(this->ptr).reference_tokens,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

explicit DataNode(std::string_view ptr_name, size_t pos): ExpressionNode(pos), name(ptr_name), ptr(json::json_pointer(convert_dot_to_ptr(ptr_name))) {}